

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  SudokuGitter gitter;
  tuple<SudokuGitter,_SudokuGitter> bigGitter;
  SudokuGitter SStack_f8;
  SudokuGitter local_d0;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_a8;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_58;
  
  mainClassicSudoku(&SStack_f8,9);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&local_d0.cells,&SStack_f8.cells);
  local_d0.quadHeight = SStack_f8.quadHeight;
  local_d0.elements = SStack_f8.elements;
  local_d0.quadWidth = SStack_f8.quadWidth;
  visualizeClassicSudoku(&local_d0);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_d0.cells);
  mainBigSudoku((tuple<SudokuGitter,_SudokuGitter> *)&local_58,9);
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::_Tuple_impl(&local_a8,&local_58);
  visualizeBigSudoku((tuple<SudokuGitter,_SudokuGitter> *)&local_a8);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_a8.super__Head_base<0UL,_SudokuGitter,_false>);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_a8);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_58.super__Head_base<0UL,_SudokuGitter,_false>);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_58);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&SStack_f8.cells);
  return 0;
}

Assistant:

int main() {
    int elements = 9;
    SudokuGitter gitter = mainClassicSudoku(elements);
    visualizeClassicSudoku(gitter);

    tuple<SudokuGitter, SudokuGitter> bigGitter = mainBigSudoku(elements);
    visualizeBigSudoku(bigGitter);
}